

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  __single_object this_00;
  TargetTypes targetTypes_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  pointer pcVar4;
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  *this_01;
  reference this_02;
  reference pvVar5;
  pointer pcVar6;
  mapped_type *ppcVar7;
  pointer lg_00;
  uint local_b4;
  uint i_1;
  pointer local_a8;
  cmLocalGenerator *local_a0;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_98;
  __single_object gt;
  cmLocalGenerator *lg;
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *ownedImpTgt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  *__range2;
  value_type *mf;
  undefined1 local_48 [4];
  uint i;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  importedMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = targetTypes;
  std::
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::map((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
         *)local_48);
  mf._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::size(&this->Makefiles);
    if (sVar2 <= mf._4_4_) break;
    pvVar3 = std::
             vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ::operator[](&this->Makefiles,(ulong)mf._4_4_);
    pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(pvVar3);
    this_01 = cmMakefile::GetOwnedImportedTargets(pcVar4);
    __end2 = std::
             vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ::begin(this_01);
    ownedImpTgt = (unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *)
                  std::
                  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                  ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
                                  *)&ownedImpTgt);
      if (!bVar1) break;
      this_02 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
                ::operator*(&__end2);
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&this->LocalGenerators,(ulong)mf._4_4_);
      gt._M_t.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
      .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
      super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>)
           std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get(pvVar5);
      local_a0 = (cmLocalGenerator *)
                 std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::get(this_02);
      std::make_unique<cmGeneratorTarget,cmTarget*,cmLocalGenerator*&>
                ((cmTarget **)&local_98,&local_a0);
      pcVar6 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                         (&local_98);
      local_a8 = std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::get(this_02);
      ppcVar7 = std::
                map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                              *)local_48,&local_a8);
      this_00 = gt;
      *ppcVar7 = pcVar6;
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::unique_ptr
                ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 &stack0xffffffffffffff50,&local_98);
      cmLocalGenerator::AddOwnedImportedGeneratorTarget
                ((cmLocalGenerator *)
                 this_00._M_t.
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                 (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 &stack0xffffffffffffff50);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 &stack0xffffffffffffff50);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_98);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    mf._4_4_ = mf._4_4_ + 1;
  }
  local_b4 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::size(&this->LocalGenerators);
    targetTypes_00 = importedMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    if (sVar2 <= local_b4) break;
    pvVar3 = std::
             vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ::operator[](&this->Makefiles,(ulong)local_b4);
    pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(pvVar3);
    pvVar5 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](&this->LocalGenerators,(ulong)local_b4);
    lg_00 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get(pvVar5);
    CreateGeneratorTargets
              (this,targetTypes_00,pcVar4,lg_00,
               (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)local_48);
    local_b4 = local_b4 + 1;
  }
  std::
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~map((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    auto& mf = this->Makefiles[i];
    for (const auto& ownedImpTgt : mf->GetOwnedImportedTargets()) {
      cmLocalGenerator* lg = this->LocalGenerators[i].get();
      auto gt = cm::make_unique<cmGeneratorTarget>(ownedImpTgt.get(), lg);
      importedMap[ownedImpTgt.get()] = gt.get();
      lg->AddOwnedImportedGeneratorTarget(std::move(gt));
    }
  }

  // Construct per-target generator information.
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i].get(),
                                 this->LocalGenerators[i].get(), importedMap);
  }
}